

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void allocate_imp_vec<ImputedData<long,double>,InputData<double,long>>
               (vector<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_>
                *impute_vec,InputData<double,_long> *input_data,int nthreads)

{
  long lVar1;
  size_t row;
  
  std::vector<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_>::resize
            (impute_vec,input_data->nrows);
  if (input_data->nrows != 0) {
    lVar1 = 0;
    row = 0;
    do {
      if ((input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[row] != '\0') {
        initialize_impute_calc<ImputedData<long,double>,InputData<double,long>>
                  ((ImputedData<long,_double> *)
                   ((long)&(((impute_vec->
                             super__Vector_base<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->num_sum).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar1),
                   input_data,row);
      }
      row = row + 1;
      lVar1 = lVar1 + 0xf0;
    } while (row < input_data->nrows);
  }
  return;
}

Assistant:

void allocate_imp_vec(std::vector<ImputedData> &impute_vec, InputData &input_data, int nthreads)
{
    impute_vec.resize(input_data.nrows);
    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(impute_vec, input_data)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        if (input_data.has_missing[row])
            initialize_impute_calc(impute_vec[row], input_data, row);
}